

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * __thiscall Catch::AssertionResult::getExpandedExpression_abi_cxx11_(AssertionResult *this)

{
  ulong uVar1;
  string *in_RDI;
  AssertionResultData *in_stack_00000008;
  string expr;
  string local_30 [8];
  AssertionResult *in_stack_ffffffffffffffd8;
  
  AssertionResultData::reconstructExpression_abi_cxx11_(in_stack_00000008);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)in_RDI,local_30);
  }
  else {
    getExpression_abi_cxx11_(in_stack_ffffffffffffffd8);
  }
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string AssertionResult::getExpandedExpression() const {
        std::string expr = m_resultData.reconstructExpression();
        return expr.empty()
                ? getExpression()
                : expr;
    }